

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O0

void spdlog::details::fmt_helper::pad_uint<unsigned_long,500ul>
               (unsigned_long n,uint width,
               basic_memory_buffer<char,_500UL,_std::allocator<char>_> *dest)

{
  uint uVar1;
  char *zeroes;
  uint digits;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *dest_local;
  uint width_local;
  unsigned_long n_local;
  
  uVar1 = count_digits<unsigned_long>(n);
  if (uVar1 < width) {
    ::fmt::v5::internal::basic_buffer<char>::append<char>
              ((basic_buffer<char> *)dest,"0000000000000000000",
               "0000000000000000000" + ((ulong)width - (ulong)uVar1));
  }
  append_int<unsigned_long,500ul>(n,dest);
  return;
}

Assistant:

inline void pad_uint(T n, unsigned int width, fmt::basic_memory_buffer<char, Buffer_Size> &dest)
{
    static_assert(std::is_unsigned<T>::value, "pad_uint must get unsigned T");
    auto digits = count_digits(n);
    if (width > digits)
    {
        const char *zeroes = "0000000000000000000";
        dest.append(zeroes, zeroes + width - digits);
    }
    append_int(n, dest);
}